

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::on_mouse_down(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                *this,unsigned_long btn,unsigned_long state,long x,long y,bool is_double_click)

{
  ulong uVar1;
  unsigned_long uVar2;
  bool bVar3;
  byte bVar4;
  rectangle *prVar5;
  long lVar6;
  unsigned_long uVar7;
  data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pdVar8;
  unsigned_long *puVar9;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  scrollable_region *in_RDI;
  long in_R8;
  byte in_R9B;
  rectangle *in_stack_00000008;
  base_window *in_stack_00000010;
  unsigned_long j;
  unsigned_long last;
  unsigned_long first;
  unsigned_long i;
  long h;
  arg1_type in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  unsigned_long local_58;
  unsigned_long local_40;
  long local_38;
  byte local_29;
  long local_28;
  long local_20;
  ulong local_18;
  long local_10;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  prVar5 = scrollable_region::display_rect(in_RDI);
  bVar3 = rectangle::contains(prVar5,local_20,local_28);
  if ((((bVar3) && (local_10 == 1)) && (((in_RDI->super_drawable).enabled & 1U) != 0)) &&
     (((in_RDI->super_drawable).hidden & 1U) == 0)) {
    if (((in_RDI[1].super_drawable.rect.l & 1) == 0) ||
       (((local_18 & 0x10) == 0 && ((local_18 & 8) == 0)))) {
      array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      ::reset((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
               *)&in_RDI[1].super_drawable.rect.t);
      while (bVar3 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                     ::move_next((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                  *)&in_RDI[1].super_drawable.rect.t), bVar3) {
        pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::element((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                            *)&in_RDI[1].super_drawable.rect.t);
        pdVar8->is_selected = false;
      }
    }
    prVar5 = scrollable_region::total_rect(in_RDI);
    lVar6 = rectangle::top(prVar5);
    local_28 = local_28 - lVar6;
    local_38 = 0;
    for (local_40 = 0; uVar2 = local_40,
        uVar7 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                ::size((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                        *)&in_RDI[1].super_drawable.rect.t), uVar2 < uVar7; local_40 = local_40 + 1)
    {
      pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
               ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                             *)&in_RDI[1].super_drawable.rect.t,local_40);
      local_38 = pdVar8->height + local_38;
      if (local_28 <= local_38) {
        if ((in_RDI[1].super_drawable.rect.l & 1) == 0) {
          pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                   ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                 *)&in_RDI[1].super_drawable.rect.t,local_40);
          pdVar8->is_selected = true;
          in_RDI[1].super_drawable.z_order_value = local_40;
          if (((local_29 & 1) == 0) ||
             (bVar3 = any_function<void_(unsigned_long),_void,_1UL>::is_set
                                ((any_function<void_(unsigned_long),_void,_1UL> *)0x452d8a), !bVar3)
             ) {
            bVar3 = any_function<void_(unsigned_long),_void,_1UL>::is_set
                              ((any_function<void_(unsigned_long),_void,_1UL> *)0x452db9);
            if (bVar3) {
              any_function<void_(unsigned_long),_void,_1UL>::operator()
                        ((any_function<void_(unsigned_long),_void,_1UL> *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
            }
          }
          else {
            any_function<void_(unsigned_long),_void,_1UL>::operator()
                      ((any_function<void_(unsigned_long),_void,_1UL> *)
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
          }
        }
        else if ((local_18 & 0x10) == 0) {
          if ((local_18 & 8) == 0) {
            pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                     ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                   *)&in_RDI[1].super_drawable.rect.t,local_40);
            pdVar8->is_selected = true;
            in_RDI[1].super_drawable.z_order_value = local_40;
            if (((local_29 & 1) == 0) ||
               (bVar3 = any_function<void_(unsigned_long),_void,_1UL>::is_set
                                  ((any_function<void_(unsigned_long),_void,_1UL> *)0x452cee),
               !bVar3)) {
              bVar3 = any_function<void_(unsigned_long),_void,_1UL>::is_set
                                ((any_function<void_(unsigned_long),_void,_1UL> *)0x452d1d);
              if (bVar3) {
                any_function<void_(unsigned_long),_void,_1UL>::operator()
                          ((any_function<void_(unsigned_long),_void,_1UL> *)
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
              }
            }
            else {
              any_function<void_(unsigned_long),_void,_1UL>::operator()
                        ((any_function<void_(unsigned_long),_void,_1UL> *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
            }
          }
          else {
            puVar9 = std::min<unsigned_long>
                               (&local_40,(unsigned_long *)&in_RDI[1].super_drawable.z_order_value);
            local_58 = *puVar9;
            puVar9 = std::max<unsigned_long>
                               (&local_40,(unsigned_long *)&in_RDI[1].super_drawable.z_order_value);
            uVar1 = *puVar9;
            for (; local_58 <= uVar1; local_58 = local_58 + 1) {
              pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                       ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                     *)&in_RDI[1].super_drawable.rect.t,local_58);
              pdVar8->is_selected = true;
            }
          }
        }
        else {
          pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                   ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                 *)&in_RDI[1].super_drawable.rect.t,local_40);
          bVar4 = pdVar8->is_selected ^ 0xff;
          pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                   ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                 *)&in_RDI[1].super_drawable.rect.t,local_40);
          pdVar8->is_selected = (bool)(bVar4 & 1);
          pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                   ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>::data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                 *)&in_RDI[1].super_drawable.rect.t,local_40);
          if ((pdVar8->is_selected & 1U) != 0) {
            in_RDI[1].super_drawable.z_order_value = local_40;
          }
        }
        break;
      }
    }
    base_window::invalidate_rectangle(in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

void list_box<S>::
    on_mouse_down (
        unsigned long btn,
        unsigned long state,
        long x,
        long y,
        bool is_double_click
    )
    {
        if (display_rect().contains(x,y) && btn == base_window::LEFT && enabled && !hidden )
        {
            if ( ms_enabled == false || 
                 ((!(state&base_window::CONTROL)) && !(state&base_window::SHIFT)))
            {
                items.reset();
                while (items.move_next())
                {
                    items.element().is_selected = false;
                }
            }

            y -= total_rect().top();
            long h = 0;
            for (unsigned long i = 0; i < items.size(); ++i)
            {
                h += items[i].height;
                if (h >= y)
                {
                    if (ms_enabled)
                    {
                        if (state&base_window::CONTROL)
                        {
                            items[i].is_selected = !items[i].is_selected;
                            if (items[i].is_selected)
                                last_selected = i;
                        }
                        else if (state&base_window::SHIFT)
                        {
                            // we want to select everything between (and including) the
                            // current thing clicked and last_selected.
                            const unsigned long first = std::min(i,last_selected);
                            const unsigned long last = std::max(i,last_selected);
                            for (unsigned long j = first; j <= last; ++j)
                                items[j].is_selected = true;
                        }
                        else
                        {
                            items[i].is_selected = true;
                            last_selected = i;
                            if (is_double_click && event_handler.is_set())
                                event_handler(i);
                            else if (single_click_event_handler.is_set())
                                single_click_event_handler(i);
                        }
                    }
                    else
                    {
                        items[i].is_selected = true;
                        last_selected = i;
                        if (is_double_click && event_handler.is_set())
                            event_handler(i);
                        else if (single_click_event_handler.is_set())
                            single_click_event_handler(i);
                    }

                    break;
                }
            }

            parent.invalidate_rectangle(rect);
        }
    }